

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O0

void __thiscall sjtu::TrainManager::delete_train(TrainManager *this,int argc,string *argv)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  void *pvVar3;
  uint uVar4;
  long in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  pair<long,_bool> pVar5;
  uint in_stack_000000a4;
  uint in_stack_000000a8;
  uint in_stack_000000ac;
  TrainManager *in_stack_000000b0;
  int id;
  int train_id;
  int i_1;
  trainType *train;
  pair<long,_bool> ret;
  int i;
  string trainID;
  char *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  pair<unsigned_int,_bool> in_stack_fffffffffffffe78;
  DynamicFileManager<sjtu::trainType> *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  StringHasher *in_stack_fffffffffffffe90;
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *this_01;
  unsigned_long_long *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  string local_110 [32];
  hashType local_f0;
  undefined1 local_e1 [33];
  hashType local_c0;
  uint local_b4;
  undefined1 local_b0;
  uint local_ac;
  int local_a8;
  int local_a4;
  long local_a0;
  long local_98;
  undefined1 local_90;
  string local_88 [32];
  hashType local_68;
  long local_60;
  byte local_58;
  int local_3c;
  string local_38 [32];
  long local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::__cxx11::string::string(local_38);
  local_3c = 0;
  while( true ) {
    if (local_c <= local_3c) {
      std::__cxx11::string::string(local_88,local_38);
      local_68 = StringHasher::operator()(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      pVar5 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                        ((BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *
                         )CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffed8);
      local_98 = pVar5.first;
      local_90 = pVar5.second;
      local_60 = local_98;
      local_58 = local_90;
      std::__cxx11::string::~string(local_88);
      if ((local_58 & 1) == 0) {
        pvVar3 = (void *)std::ostream::operator<<(&std::cout,-1);
        std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        local_a0 = (**(code **)(*(long *)in_RDI[4] + 0x10))((long *)in_RDI[4],&local_60);
        if ((*(byte *)(local_a0 + 0xa799) & 1) == 1) {
          pvVar3 = (void *)std::ostream::operator<<(&std::cout,-1);
          std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
        }
        else {
          local_a4 = 0;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)(local_a0 + 0xa7a0);
          local_a8 = SUB164(auVar1 / ZEXT816(0xa7a8),0) + -1;
          for (; local_a4 < *(int *)(local_a0 + 0x18); local_a4 = local_a4 + 1) {
            in_stack_fffffffffffffe80 = (DynamicFileManager<sjtu::trainType> *)*in_RDI;
            in_stack_fffffffffffffe88 = (string *)(in_RDI + 2);
            in_stack_fffffffffffffe90 = (StringHasher *)(local_a0 + 0x20 + (long)local_a4 * 0x1a8);
            this_01 = (BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>
                       *)local_e1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_e1 + 1),(char *)in_stack_fffffffffffffe90,
                       (allocator *)this_01);
            local_c0 = StringHasher::operator()(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88)
            ;
            in_stack_fffffffffffffe78 =
                 BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::
                 find(this_01,(unsigned_long_long *)in_stack_fffffffffffffe90);
            uVar4 = in_stack_fffffffffffffe78.first;
            local_b0 = in_stack_fffffffffffffe78.second;
            local_b4 = uVar4;
            std::__cxx11::string::~string((string *)(local_e1 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_e1);
            local_ac = uVar4;
            bitset_set(in_stack_000000b0,in_stack_000000ac,in_stack_000000a8,in_stack_000000a4);
          }
          this_00 = (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)
                    in_RDI[1];
          std::__cxx11::string::string(local_110,local_38);
          local_f0 = StringHasher::operator()(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::erase
                    (this_00,&local_f0);
          DynamicFileManager<sjtu::trainType>::release
                    (in_stack_fffffffffffffe80,(locType)in_stack_fffffffffffffe78);
          std::__cxx11::string::~string(local_110);
          pvVar3 = (void *)std::ostream::operator<<(&std::cout,0);
          std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
        }
      }
      std::__cxx11::string::~string(local_38);
      return;
    }
    in_stack_fffffffffffffee7 = std::operator==(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58)
    ;
    if (!(bool)in_stack_fffffffffffffee7) break;
    std::__cxx11::string::operator=(local_38,(string *)((long)local_3c * 0x20 + 0x20 + local_18));
    local_3c = local_3c + 2;
  }
  uVar2 = __cxa_allocate_exception(0x68);
  invalid_command::invalid_command
            ((invalid_command *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  __cxa_throw(uVar2,&invalid_command::typeinfo,invalid_command::~invalid_command);
}

Assistant:

void delete_train(int argc , std::string *argv)
		{
			std::string trainID;
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-i") trainID = argv[i + 1];
				else throw invalid_command();
			auto ret = TrainBpTree -> find(hasher(trainID));
			if (ret.second == false) std::cout << -1 << std::endl;
			else
			{
				trainType *train = TrainFile -> read(ret.first);
				if (train -> is_released == true) std::cout << -1 << std::endl;
				else
				{
					for (int i = 0 , train_id = train -> offset / sizeof (DynamicFileManager<trainType>::valueType) - 1;i < train -> stationNum;++ i)
					{
						int id = StationBpTree -> find(hasher(train -> stations[i].stationName)).first;
						bitset_set(id , train_id , 0);
					}
					TrainBpTree -> erase(hasher(trainID)) , TrainFile -> release(ret.first);
					std::cout << 0 << std::endl;
				}
			}
		}